

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O3

bool __thiscall SQTable::NewSlot(SQTable *this,SQObjectPtr *key,SQObjectPtr *val)

{
  SQObjectPtr *pSVar1;
  SQUnsignedInteger *pSVar2;
  SQObjectType SVar3;
  SQObjectType SVar4;
  SQObjectValue SVar5;
  _HashNode *p_Var6;
  SQTable *pSVar7;
  SQObjectFlags SVar8;
  undefined3 uVar9;
  uint32_t uVar10;
  SQObjectValue SVar11;
  ulong uVar12;
  _HashNode *p_Var13;
  _HashNode *p_Var14;
  SQFloat SVar15;
  ulong uVar16;
  _HashNode *p_Var17;
  
  SVar5 = (key->super_SQObject)._unVal;
  SVar3 = (key->super_SQObject)._type;
  do {
    if ((int)SVar3 < 0x5000004) {
      SVar11 = SVar5;
      if ((SVar3 != OT_BOOL) && (SVar3 != OT_INTEGER)) {
LAB_0013ec1c:
        SVar11.nInteger = SVar5.nInteger >> 4;
      }
    }
    else {
      SVar11.nInteger = (long)SVar5.fFloat;
      if (SVar3 != OT_FLOAT) {
        if (SVar3 != OT_STRING) goto LAB_0013ec1c;
        SVar11 = (SQObjectValue)(SVar5.pString)->_hash;
      }
    }
    uVar12 = (ulong)((uint)SVar11.fFloat & this->_numofnodes_minus_one);
    p_Var17 = this->_nodes + uVar12;
    p_Var14 = p_Var17;
    do {
      if (((p_Var14->key).super_SQObject._unVal.pTable == SVar5.pTable) &&
         ((p_Var14->key).super_SQObject._type == SVar3)) {
        SVar3 = (p_Var14->val).super_SQObject._type;
        pSVar7 = (p_Var14->val).super_SQObject._unVal.pTable;
        SVar8 = (val->super_SQObject)._flags;
        uVar9 = *(undefined3 *)&(val->super_SQObject).field_0x5;
        SVar5 = (val->super_SQObject)._unVal;
        (p_Var14->val).super_SQObject._type = (val->super_SQObject)._type;
        (p_Var14->val).super_SQObject._flags = SVar8;
        *(undefined3 *)&(p_Var14->val).super_SQObject.field_0x5 = uVar9;
        (p_Var14->val).super_SQObject._unVal = SVar5;
        if (((p_Var14->val).super_SQObject._type & 0x8000000) != 0) {
          pSVar2 = &(((p_Var14->val).super_SQObject._unVal.pTable)->super_SQDelegable).
                    super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar2 = *pSVar2 + 1;
        }
        if ((SVar3 >> 0x1b & 1) != 0) {
          pSVar2 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar2 = *pSVar2 - 1;
          if (*pSVar2 == 0) {
            (*(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [2])();
          }
        }
        return false;
      }
      p_Var14 = p_Var14->next;
    } while (p_Var14 != (_HashNode *)0x0);
    SVar4 = (p_Var17->key).super_SQObject._type;
    if (SVar4 != OT_NULL) {
      if ((int)SVar4 < 0x5000004) {
        if ((SVar4 == OT_BOOL) || (SVar4 == OT_INTEGER)) {
          SVar15 = (p_Var17->key).super_SQObject._unVal.fFloat;
        }
        else {
LAB_0013ec9a:
          SVar15 = (SQFloat)((p_Var17->key).super_SQObject._unVal.nInteger >> 4);
        }
      }
      else if (SVar4 == OT_FLOAT) {
        SVar15 = (SQFloat)(long)(p_Var17->key).super_SQObject._unVal.fFloat;
      }
      else {
        if (SVar4 != OT_STRING) goto LAB_0013ec9a;
        SVar15 = (SQFloat)((p_Var17->key).super_SQObject._unVal.pString)->_hash;
      }
      p_Var14 = this->_firstfree;
      if ((p_Var14 < p_Var17) &&
         (uVar16 = (ulong)((uint)SVar15 & this->_numofnodes_minus_one), uVar16 != uVar12)) {
        pSVar1 = &p_Var17->key;
        p_Var6 = this->_nodes + uVar16;
        do {
          p_Var13 = p_Var6;
          p_Var6 = p_Var13->next;
        } while (p_Var6 != p_Var17);
        p_Var13->next = p_Var14;
        SVar4 = (p_Var14->key).super_SQObject._type;
        pSVar7 = (p_Var14->key).super_SQObject._unVal.pTable;
        SVar8 = (pSVar1->super_SQObject)._flags;
        uVar9 = *(undefined3 *)&(pSVar1->super_SQObject).field_0x5;
        SVar11 = (p_Var17->key).super_SQObject._unVal;
        (p_Var14->key).super_SQObject._type = (pSVar1->super_SQObject)._type;
        (p_Var14->key).super_SQObject._flags = SVar8;
        *(undefined3 *)&(p_Var14->key).super_SQObject.field_0x5 = uVar9;
        (p_Var14->key).super_SQObject._unVal = SVar11;
        if (((p_Var14->key).super_SQObject._type & 0x8000000) != 0) {
          pSVar2 = &(((p_Var14->key).super_SQObject._unVal.pTable)->super_SQDelegable).
                    super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar2 = *pSVar2 + 1;
        }
        if ((SVar4 >> 0x1b & 1) != 0) {
          pSVar2 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar2 = *pSVar2 - 1;
          if (*pSVar2 == 0) {
            (*(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [2])();
          }
        }
        SVar4 = (p_Var14->val).super_SQObject._type;
        pSVar7 = (p_Var14->val).super_SQObject._unVal.pTable;
        SVar8 = (p_Var17->val).super_SQObject._flags;
        uVar9 = *(undefined3 *)&(p_Var17->val).super_SQObject.field_0x5;
        SVar11 = (p_Var17->val).super_SQObject._unVal;
        (p_Var14->val).super_SQObject._type = (p_Var17->val).super_SQObject._type;
        (p_Var14->val).super_SQObject._flags = SVar8;
        *(undefined3 *)&(p_Var14->val).super_SQObject.field_0x5 = uVar9;
        (p_Var14->val).super_SQObject._unVal = SVar11;
        if (((p_Var14->val).super_SQObject._type & 0x8000000) != 0) {
          pSVar2 = &(((p_Var14->val).super_SQObject._unVal.pTable)->super_SQDelegable).
                    super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar2 = *pSVar2 + 1;
        }
        if ((SVar4 >> 0x1b & 1) != 0) {
          pSVar2 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar2 = *pSVar2 - 1;
          if (*pSVar2 == 0) {
            (*(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [2])();
          }
        }
        p_Var14->next = p_Var17->next;
        pSVar7 = (p_Var17->key).super_SQObject._unVal.pTable;
        SVar4 = (p_Var17->key).super_SQObject._type;
        (pSVar1->super_SQObject)._type = 0;
        (pSVar1->super_SQObject)._flags = '\0';
        *(undefined3 *)&(pSVar1->super_SQObject).field_0x5 = 0;
        (p_Var17->key).super_SQObject._unVal.pTable = (SQTable *)0x0;
        (p_Var17->key).super_SQObject._type = OT_NULL;
        if ((SVar4 >> 0x1b & 1) != 0) {
          pSVar2 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar2 = *pSVar2 - 1;
          if (*pSVar2 == 0) {
            (*(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [2])();
          }
        }
        pSVar7 = (p_Var17->val).super_SQObject._unVal.pTable;
        SVar4 = (p_Var17->val).super_SQObject._type;
        (p_Var17->val).super_SQObject._type = 0;
        (p_Var17->val).super_SQObject._flags = '\0';
        *(undefined3 *)&(p_Var17->val).super_SQObject.field_0x5 = 0;
        (p_Var17->val).super_SQObject._unVal.pTable = (SQTable *)0x0;
        (p_Var17->val).super_SQObject._type = OT_NULL;
        if ((SVar4 >> 0x1b & 1) != 0) {
          pSVar2 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar2 = *pSVar2 - 1;
          if (*pSVar2 == 0) {
            (*(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [2])();
          }
        }
        p_Var17->next = (_HashNode *)0x0;
      }
      else {
        p_Var14->next = p_Var17->next;
        p_Var17->next = p_Var14;
        p_Var17 = p_Var14;
      }
    }
    SVar4 = (p_Var17->key).super_SQObject._type;
    pSVar7 = (p_Var17->key).super_SQObject._unVal.pTable;
    SVar8 = (key->super_SQObject)._flags;
    uVar9 = *(undefined3 *)&(key->super_SQObject).field_0x5;
    SVar11 = (key->super_SQObject)._unVal;
    (p_Var17->key).super_SQObject._type = (key->super_SQObject)._type;
    (p_Var17->key).super_SQObject._flags = SVar8;
    *(undefined3 *)&(p_Var17->key).super_SQObject.field_0x5 = uVar9;
    (p_Var17->key).super_SQObject._unVal = SVar11;
    if (((p_Var17->key).super_SQObject._type & 0x8000000) != 0) {
      pSVar2 = &(((p_Var17->key).super_SQObject._unVal.pTable)->super_SQDelegable).
                super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar2 = *pSVar2 + 1;
    }
    if ((SVar4 >> 0x1b & 1) != 0) {
      pSVar2 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar2 = *pSVar2 - 1;
      if (*pSVar2 == 0) {
        (*(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    p_Var14 = this->_firstfree;
    while( true ) {
      if (((p_Var14->key).super_SQObject._type == OT_NULL) && (p_Var14->next == (_HashNode *)0x0)) {
        SVar4 = (p_Var17->val).super_SQObject._type;
        pSVar7 = (p_Var17->val).super_SQObject._unVal.pTable;
        SVar8 = (val->super_SQObject)._flags;
        uVar9 = *(undefined3 *)&(val->super_SQObject).field_0x5;
        SVar11 = (val->super_SQObject)._unVal;
        (p_Var17->val).super_SQObject._type = (val->super_SQObject)._type;
        (p_Var17->val).super_SQObject._flags = SVar8;
        *(undefined3 *)&(p_Var17->val).super_SQObject.field_0x5 = uVar9;
        (p_Var17->val).super_SQObject._unVal = SVar11;
        if (((p_Var17->val).super_SQObject._type & 0x8000000) != 0) {
          pSVar2 = &(((p_Var17->val).super_SQObject._unVal.pTable)->super_SQDelegable).
                    super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar2 = *pSVar2 + 1;
        }
        if ((SVar4 >> 0x1b & 1) != 0) {
          pSVar2 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar2 = *pSVar2 - 1;
          if (*pSVar2 == 0) {
            (*(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [2])();
          }
        }
        if ((SVar3 == OT_STRING) && (this->_numofnodes_minus_one < 0x20)) {
          uVar12 = this->_classTypeId;
          uVar10 = this->_usednodes;
          if (uVar10 == 0 || uVar12 != 0) {
            uVar16 = 0xcbf29ce484222325;
            if (uVar12 != 0) {
              uVar16 = uVar12;
            }
            this->_classTypeId =
                 (((ulong)((uint)((ulong)SVar5.nInteger >> 0x13) & 0xff) ^
                  ((ulong)((uint)((ulong)SVar5.nInteger >> 0xb) & 0xff) ^
                  ((ulong)((uint)((ulong)SVar5.nInteger >> 3) & 0xff) ^
                  (((uint)((int)p_Var17 - *(int *)&this->_nodes) >> 3) * -0x33333333 & 0xff ^ uVar16
                  ) * 0x100000001b3) * 0x100000001b3) * 0x100000001b3) * 0x100000001b3 ^
                 (ulong)SVar5.nInteger >> 0x1b & 0xff) * 0x100000001b3;
          }
        }
        else {
          this->_classTypeId = 0;
          uVar10 = this->_usednodes;
        }
        this->_usednodes = uVar10 + 1;
        return true;
      }
      if (p_Var14 == this->_nodes) break;
      p_Var14 = p_Var14 + -1;
      this->_firstfree = p_Var14;
    }
    Rehash(this,true);
  } while( true );
}

Assistant:

bool SQTable::NewSlot(const SQObjectPtr &__restrict key,const SQObjectPtr &__restrict val  VT_DECL_ARG)
{
    assert(sq_type(key) != OT_NULL);
    SQHash h = HashObj(key) & _numofnodes_minus_one;
    _HashNode *n = _Get(key, h);
    if (n) {
        n->val = val;
        VT_CODE(if (var_trace_arg) n->varTrace = *var_trace_arg);
        VT_TRACE_SINGLE(n, val, _ss(this)->_root_vm);
        return false;
    }
    _HashNode *mp = &_nodes[h];
    n = mp;

    //key not found I'll insert it
    //main pos is not free

    if(sq_type(mp->key) != OT_NULL) {
        n = _firstfree;  /* get a free place */
        SQHash mph = HashObj(mp->key) & _numofnodes_minus_one;
        _HashNode *othern;  /* main position of colliding node */

        if (mp > n && (othern = &_nodes[mph]) != mp){
            /* yes; move colliding node into free position */
            while (othern->next != mp){
                assert(othern->next != NULL);
                othern = othern->next;  /* find previous */
            }
            othern->next = n;  /* redo the chain with `n' in place of `mp' */
            n->key = mp->key;
            n->val = mp->val;/* copy colliding node into free pos. (mp->next also goes) */
            n->next = mp->next;
            VT_COPY_SINGLE(mp, n);
            mp->key.Null();
            mp->val.Null();
            VT_CLEAR_SINGLE(mp);
            mp->next = NULL;  /* now `mp' is free */
        }
        else{
            /* new node will go into free position */
            n->next = mp->next;  /* chain new position */
            mp->next = n;
            mp = n;
        }
    }
    mp->key = key;

    for (;;) {  /* correct `firstfree' */
        if (sq_type(_firstfree->key) == OT_NULL && _firstfree->next == NULL) {
            mp->val = val;
            VT_CODE(if (var_trace_arg) mp->varTrace = *var_trace_arg);
            VT_TRACE_SINGLE(mp, val, _ss(this)->_root_vm);

            // update class type id
            if (sq_isstring(key) && (_numofnodes_minus_one < (1<<TBL_CLASS_TYPE_MEMBER_BITS))) {
                if (_classTypeId != 0 || _usednodes==0) {
                    uint8_t insertPos = mp - _nodes;
                    _classTypeId = class_type_hash_update_1(_classTypeId ? _classTypeId : CLASS_TYPE_HASH_INIT, insertPos);

                    // Use SQString address as identifier, strings are unique, immutable and strored in a table.
                    // That means that all script strings share the same reference to SQString.
                    // 32 provides more than realistic address range.
                    uint32_t strIdBits = uint32_t( (uintptr_t(_string(key)) >> 3) & 0xFFFFFFFF );
                    _classTypeId = class_type_hash_update_4(_classTypeId, strIdBits);
                }
            } else {
                _classTypeId = 0;
            }

            ++_usednodes;

            return true;  /* OK; table still has a free place */
        }
        else if (_firstfree == _nodes) break;  /* cannot decrement from here */
        else (_firstfree)--;
    }
    Rehash(true);
    return NewSlot(key, val  VT_CODE(VT_COMMA var_trace_arg));
}